

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O2

bool S2DecodePointsCompressed(Decoder *decoder,int level,Span<Vector3<double>_> points)

{
  uchar *__src;
  VType *pVVar1;
  undefined1 auVar2 [16];
  pointer pFVar3;
  VType VVar4;
  bool bVar5;
  int iVar6;
  int32 iVar7;
  int32 iVar8;
  long lVar9;
  _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  *p_Var10;
  pointer pFVar11;
  FaceRun *pFVar12;
  ulong __n;
  size_t sVar13;
  int iVar14;
  pointer pVVar15;
  char *__s;
  FaceRun *pFVar16;
  undefined4 in_register_00000034;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  pointer pVVar21;
  pointer pFVar22;
  double v;
  uint32 zig_zag_encoded_deriv_qi;
  FaceRun *local_118;
  pointer local_110;
  _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  *local_108;
  uint num_off_center;
  ostream *local_f8;
  _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  *local_e8;
  uint32 zig_zag_encoded_deriv_pi;
  undefined4 uStack_dc;
  VType VStack_d8;
  VType local_d0;
  Faces faces;
  NthDerivativeCoder pi_coder;
  NthDerivativeCoder qi_coder;
  
  local_110 = (pointer)CONCAT44(in_register_00000034,level);
  local_108 = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
               *)points.len_;
  pVVar15 = points.ptr_;
  faces.faces_.
  super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  faces.faces_.
  super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  faces.faces_.
  super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118 = (FaceRun *)0x0;
  pFVar16 = (FaceRun *)0x0;
  for (iVar6 = 0;
      pFVar22 = faces.faces_.
                super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                ._M_impl.super__Vector_impl_data._M_finish, iVar6 < (int)local_108;
      iVar6 = iVar6 + iVar14) {
    bVar5 = Decoder::get_varint64(decoder,(uint64 *)&pi_coder);
    if (!bVar5) goto LAB_002431ad;
    sVar13 = 6;
    auVar2._8_8_ = 0;
    auVar2._0_4_ = pi_coder.n_;
    auVar2._4_4_ = pi_coder.m_;
    lVar9 = SUB168(auVar2 / ZEXT816(6),0);
    __s = (char *)((ulong)pi_coder._0_8_ % 6);
    uVar20 = 0;
    if ((2 < pi_coder.m_ >> 1) || (iVar14 = SUB164(auVar2 / ZEXT816(6),0), iVar14 < 1))
    goto LAB_002431af;
    if (pFVar22 == pFVar16) {
      p_Var10 = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                 *)std::
                   vector<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                   ::_M_check_len(&faces.faces_,6,__s);
      pFVar11 = std::
                _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                ::_M_allocate(p_Var10,sVar13);
      *(ulong *)((long)pFVar11 + ((long)pFVar16 - (long)local_118)) = lVar9 << 0x20 | (ulong)__s;
      pFVar3 = pFVar11;
      for (pFVar12 = local_118; pFVar22 = pFVar3 + 1, pFVar12 != pFVar16; pFVar12 = pFVar12 + 1) {
        *pFVar3 = *pFVar12;
        pFVar3 = pFVar22;
      }
      local_e8 = p_Var10;
      if (local_118 != (FaceRun *)0x0) {
        operator_delete(local_118);
      }
      pFVar16 = pFVar11 + (long)local_e8;
      local_118 = pFVar11;
      faces.faces_.
      super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar11;
      faces.faces_.
      super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar16;
    }
    else {
      *pFVar22 = (FaceRun)(lVar9 << 0x20 | (ulong)__s);
      pFVar22 = pFVar22 + 1;
    }
    faces.faces_.
    super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar22;
  }
  NthDerivativeCoder::NthDerivativeCoder(&pi_coder,2);
  NthDerivativeCoder::NthDerivativeCoder(&qi_coder,2);
  pFVar3 = faces.faces_.
           super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __n = (ulong)((((int)local_110 + 7) / 8) * 2);
  lVar9 = (long)pFVar22 -
          (long)faces.faces_.
                super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_118 = (FaceRun *)(double)(1 << ((byte)local_110 & 0x1f));
  uVar18 = 0;
  p_Var10 = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
             *)0x0;
  pVVar21 = pVVar15;
  while (local_108 != p_Var10) {
    local_e8 = p_Var10;
    if (p_Var10 ==
        (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
         *)0x0) {
      sVar13 = Decoder::avail(decoder);
      if (sVar13 < __n) goto LAB_002431ad;
      _num_off_center = 0;
      __src = decoder->buf_;
      local_110 = pVVar21;
      memcpy(&num_off_center,__src,__n);
      pVVar21 = local_110;
      decoder->buf_ = __src + __n;
      util_bits::DeinterleaveUint32
                (_num_off_center,&zig_zag_encoded_deriv_pi,&zig_zag_encoded_deriv_qi);
      iVar7 = NthDerivativeCoder::Decode(&pi_coder,zig_zag_encoded_deriv_pi);
      uVar20 = zig_zag_encoded_deriv_qi;
    }
    else {
      bVar5 = Decoder::get_varint64(decoder,(uint64 *)&num_off_center);
      if (!bVar5) goto LAB_002431ad;
      util_bits::DeinterleaveUint32
                (_num_off_center,&zig_zag_encoded_deriv_pi,&zig_zag_encoded_deriv_qi);
      iVar7 = NthDerivativeCoder::Decode
                        (&pi_coder,-(zig_zag_encoded_deriv_pi & 1) ^ zig_zag_encoded_deriv_pi >> 1);
      uVar20 = -(zig_zag_encoded_deriv_qi & 1) ^ zig_zag_encoded_deriv_qi >> 1;
    }
    iVar8 = NthDerivativeCoder::Decode(&qi_coder,uVar20);
    lVar17 = (long)(int)uVar18;
    if (lVar9 >> 3 == lVar17) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&num_off_center,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_compression.cc"
                 ,0x9d,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_f8,"Check failed: (faces_.size()) != (face_index_) ");
LAB_00243236:
      abort();
    }
    iVar6 = pFVar3[lVar17].count;
    iVar14 = (int)(uVar18 >> 0x20);
    if (iVar6 < iVar14) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&num_off_center,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_compression.cc"
                 ,0x9e,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_f8,
                      "Check failed: (num_faces_used_for_index_) <= (faces_[face_index_].count) ");
      goto LAB_00243236;
    }
    uVar20 = (int)uVar18 + 1;
    uVar19 = (uVar18 & 0xffffffff00000000) + 0x100000000;
    if (iVar6 == iVar14) {
      uVar19 = 0x100000000;
      uVar18 = (ulong)uVar20;
      lVar17 = (long)(int)uVar20;
    }
    iVar6 = pFVar3[lVar17].face;
    local_110 = (pointer)S2::STtoUV(((double)iVar7 + 0.5) / (double)local_118);
    v = S2::STtoUV(((double)iVar8 + 0.5) / (double)local_118);
    S2::FaceUVtoXYZ((S2Point *)&num_off_center,iVar6,(double)local_110,v);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
              ((D *)&zig_zag_encoded_deriv_pi,(BasicVector<Vector3,_double,_3UL> *)&num_off_center);
    uVar18 = uVar18 & 0xffffffff | uVar19;
    pVVar21->c_[2] = local_d0;
    pVVar21->c_[0] = (VType)CONCAT44(uStack_dc,zig_zag_encoded_deriv_pi);
    pVVar21->c_[1] = VStack_d8;
    pVVar21 = pVVar21 + 1;
    p_Var10 = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
               *)((long)&(local_e8->_M_impl).super__Vector_impl_data._M_start + 1);
  }
  bVar5 = Decoder::get_varint32(decoder,&num_off_center);
  uVar20 = 0;
  if (bVar5 && (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                *)(_num_off_center & 0xffffffff) <= local_108) {
    for (; uVar20 < num_off_center; uVar20 = uVar20 + 1) {
      bVar5 = Decoder::get_varint32(decoder,&zig_zag_encoded_deriv_pi);
      if ((!bVar5 || local_108 <=
                     (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                      *)(ulong)zig_zag_encoded_deriv_pi) ||
         (sVar13 = Decoder::avail(decoder), sVar13 < 0x18)) goto LAB_002431ad;
      pVVar1 = (VType *)decoder->buf_;
      pVVar15[zig_zag_encoded_deriv_pi].c_[2] = pVVar1[2];
      VVar4 = pVVar1[1];
      pVVar15[zig_zag_encoded_deriv_pi].c_[0] = *pVVar1;
      pVVar15[zig_zag_encoded_deriv_pi].c_[1] = VVar4;
      decoder->buf_ = decoder->buf_ + 0x18;
    }
    uVar20 = 1;
  }
LAB_002431af:
  anon_unknown.dwarf_43a7c9::Faces::~Faces(&faces);
  return SUB41(uVar20,0);
LAB_002431ad:
  uVar20 = 0;
  goto LAB_002431af;
}

Assistant:

bool S2DecodePointsCompressed(Decoder* decoder, int level,
                              Span<S2Point> points) {
  Faces faces;
  if (!faces.Decode(points.size(), decoder)) {
    return false;
  }

  NthDerivativeCoder pi_coder(kDerivativeEncodingOrder);
  NthDerivativeCoder qi_coder(kDerivativeEncodingOrder);
  Faces::Iterator faces_iterator = faces.GetIterator();
  for (int i = 0; i < points.size(); ++i) {
    pair<int, int> vertex_pi_qi;
    if (i == 0) {
      if (!DecodeFirstPointFixedLength(decoder, level, &pi_coder, &qi_coder,
                                       &vertex_pi_qi)) {
        return false;
      }
    } else {
      if (!DecodePointCompressed(decoder, level, &pi_coder, &qi_coder,
                                 &vertex_pi_qi)) {
        return false;
      }
    }

    int face = faces_iterator.Next();
    points[i] =
        FacePiQitoXYZ(face, vertex_pi_qi.first, vertex_pi_qi.second, level);
  }

  unsigned int num_off_center;
  if (!decoder->get_varint32(&num_off_center) ||
      num_off_center > points.size()) {
    return false;
  }
  for (int i = 0; i < num_off_center; ++i) {
    uint32 index;
    if (!decoder->get_varint32(&index) || index >= points.size()) {
      return false;
    }
    if (decoder->avail() < sizeof(points[index])) return false;
    decoder->getn(&points[index], sizeof(points[index]));
  }
  return true;
}